

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O2

void __thiscall AixLog::Tag::~Tag(Tag *this)

{
  ~Tag(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~Tag() = default;